

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_shape.cxx
# Opt level: O1

void __thiscall Fl_Window::shape_alpha_(Fl_Window *this,Fl_Image *img,int offset)

{
  int iVar1;
  int W;
  int H;
  shape_data_type *psVar2;
  uchar *puVar3;
  byte *pbVar4;
  Fl_Bitmap *this_00;
  long lVar5;
  int iVar6;
  byte *pbVar7;
  int iVar8;
  byte bVar9;
  byte bVar10;
  uint uVar12;
  byte bVar11;
  
  iVar1 = img->d_;
  W = img->w_;
  H = img->h_;
  iVar6 = W + 0xe;
  if (-1 < W + 7) {
    iVar6 = W + 7;
  }
  puVar3 = (uchar *)operator_new__((long)((iVar6 >> 3) * H));
  if (0 < (long)H) {
    pbVar4 = (byte *)(*img->data_ + offset);
    lVar5 = 0;
    do {
      if (0 < W) {
        pbVar7 = puVar3 + lVar5 * (iVar6 >> 3);
        bVar9 = 1;
        bVar10 = 0;
        iVar8 = W;
        do {
          uVar12 = (uint)*pbVar4;
          if (iVar1 == 3) {
            uVar12 = (uint)pbVar4[2] + (uint)pbVar4[1] + (uint)*pbVar4;
          }
          bVar11 = (byte)uVar12;
          if (uVar12 != 0) {
            bVar11 = bVar9;
          }
          bVar10 = bVar11 | bVar10;
          bVar9 = bVar9 * '\x02';
          if (iVar8 == 1 || bVar9 == 0) {
            *pbVar7 = bVar10;
            pbVar7 = pbVar7 + 1;
            bVar9 = 1;
            bVar10 = 0;
          }
          pbVar4 = pbVar4 + iVar1;
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != H);
  }
  this_00 = (Fl_Bitmap *)operator_new(0x38);
  Fl_Image::Fl_Image((Fl_Image *)this_00,W,H,0);
  (this_00->super_Fl_Image)._vptr_Fl_Image = (_func_int **)&PTR__Fl_Bitmap_0024e0a0;
  this_00->array = puVar3;
  (this_00->super_Fl_Image).data_ = (char **)&this_00->array;
  (this_00->super_Fl_Image).count_ = 1;
  this_00->alloc_array = 1;
  psVar2 = shape_data_;
  this_00->id_ = 0;
  shape_data_->shape_ = (Fl_Image *)this_00;
  psVar2->todelete_ = this_00;
  return;
}

Assistant:

void Fl_Window::shape_alpha_(Fl_Image* img, int offset) {
  int i, j, d = img->d(), w = img->w(), h = img->h(), bytesperrow = (w+7)/8;
  unsigned u;
  uchar byte, onebit;
  // build an Fl_Bitmap covering the non-fully transparent/black part of the image
  const uchar* bits = new uchar[h*bytesperrow]; // to store the bitmap
  const uchar* alpha = (const uchar*)*img->data() + offset; // points to alpha value of rgba pixels
  for (i = 0; i < h; i++) {
    uchar *p = (uchar*)bits + i * bytesperrow;
    byte = 0;
    onebit = 1;
    for (j = 0; j < w; j++) {
      if (d == 3) {
        u = *alpha;
        u += *(alpha+1);
        u += *(alpha+2);
      }
      else u = *alpha;
      if (u > 0) { // if the pixel is not fully transparent/black
        byte |= onebit; // turn on the corresponding bit of the bitmap
      }
      onebit = onebit << 1; // move the single set bit one position to the left
      if (onebit == 0 || j == w-1) {
        onebit = 1;
        *p++ = byte; // store in bitmap one pack of bits
        byte = 0;
      }
      alpha += d; // point to alpha value of next pixel
    }
  }
  Fl_Bitmap* bitmap = new Fl_Bitmap(bits, w, h);
  bitmap->alloc_array = 1;
  shape_bitmap_(bitmap);
  shape_data_->todelete_ = bitmap;
}